

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O2

void __thiscall
capnp::compiler::NodeTranslator::StructTranslator::MemberInfo::MemberInfo
          (MemberInfo *this,MemberInfo *parent,uint codeOrder,Reader *decl,
          NodeSourceInfoBuilderPair builderPair,bool isInUnion)

{
  uint uVar1;
  void *pvVar2;
  SegmentReader *pSVar3;
  CapTableReader *pCVar4;
  WirePointer *pWVar5;
  StructPointerCount SVar6;
  undefined2 uVar7;
  int iVar8;
  undefined4 uVar9;
  bool bVar10;
  Which WVar11;
  uint uVar12;
  ArrayPtr<const_char> AVar13;
  Fault local_58;
  DebugComparison<capnp::compiler::Declaration::Which,_capnp::compiler::Declaration::Which> local_50
  ;
  
  this->parent = parent;
  this->codeOrder = codeOrder;
  this->index = 0;
  this->childCount = 0;
  this->childInitializedCount = 0;
  this->unionDiscriminantCount = 0;
  this->isInUnion = isInUnion;
  Declaration::Reader::getName((Reader *)&local_50,decl);
  AVar13 = (ArrayPtr<const_char>)LocatedText::Reader::getValue((Reader *)&local_50);
  (this->name).content = AVar13;
  pSVar3 = (decl->_reader).segment;
  pCVar4 = (decl->_reader).capTable;
  pvVar2 = (decl->_reader).data;
  pWVar5 = (decl->_reader).pointers;
  SVar6 = (decl->_reader).pointerCount;
  uVar7 = *(undefined2 *)&(decl->_reader).field_0x26;
  iVar8 = (decl->_reader).nestingLimit;
  uVar9 = *(undefined4 *)&(decl->_reader).field_0x2c;
  (this->declId)._reader.dataSize = (decl->_reader).dataSize;
  (this->declId)._reader.pointerCount = SVar6;
  *(undefined2 *)&(this->declId)._reader.field_0x26 = uVar7;
  (this->declId)._reader.nestingLimit = iVar8;
  *(undefined4 *)&(this->declId)._reader.field_0x2c = uVar9;
  (this->declId)._reader.data = pvVar2;
  (this->declId)._reader.pointers = pWVar5;
  (this->declId)._reader.segment = pSVar3;
  (this->declId)._reader.capTable = pCVar4;
  if ((decl->_reader).dataSize < 0x20) {
    WVar11 = FILE;
  }
  else {
    WVar11 = *(Which *)((long)(decl->_reader).data + 2);
  }
  this->declKind = WVar11;
  this->isParam = false;
  this->hasDefaultValue = false;
  (this->fieldType)._reader.data = (void *)0x0;
  (this->fieldType)._reader.pointers = (WirePointer *)0x0;
  *(undefined8 *)((long)&(this->fieldType)._reader.pointers + 6) = 0;
  (this->fieldType)._reader.segment = (SegmentReader *)0x0;
  (this->fieldType)._reader.capTable = (CapTableReader *)0x0;
  (this->fieldType)._reader.nestingLimit = 0x7fffffff;
  (this->fieldDefaultValue)._reader.data = (void *)0x0;
  (this->fieldDefaultValue)._reader.pointers = (WirePointer *)0x0;
  *(undefined8 *)((long)&(this->fieldDefaultValue)._reader.pointers + 6) = 0;
  (this->fieldDefaultValue)._reader.segment = (SegmentReader *)0x0;
  (this->fieldDefaultValue)._reader.capTable = (CapTableReader *)0x0;
  (this->fieldDefaultValue)._reader.nestingLimit = 0x7fffffff;
  Declaration::Reader::getAnnotations(&this->declAnnotations,decl);
  uVar1 = (decl->_reader).dataSize;
  if (uVar1 < 0x40) {
    this->startByte = 0;
    uVar12 = 0;
  }
  else {
    pvVar2 = (decl->_reader).data;
    this->startByte = *(uint *)((long)pvVar2 + 4);
    uVar12 = 0;
    if (0x5f < uVar1) {
      uVar12 = *(uint *)((long)pvVar2 + 8);
    }
  }
  this->endByte = uVar12;
  local_50.left = FILE;
  (this->docComment).ptr.isSet = false;
  (this->schema).ptr.isSet = false;
  (this->node)._builder.segment = builderPair.node._builder.segment;
  (this->node)._builder.capTable = builderPair.node._builder.capTable;
  (this->node)._builder.data = builderPair.node._builder.data;
  (this->node)._builder.pointers = builderPair.node._builder.pointers;
  (this->node)._builder.dataSize = builderPair.node._builder.dataSize;
  (this->node)._builder.pointerCount = builderPair.node._builder.pointerCount;
  *(undefined2 *)&(this->node)._builder.field_0x26 = builderPair.node._builder._38_2_;
  (this->sourceInfo)._builder.segment = builderPair.sourceInfo._builder.segment;
  (this->sourceInfo)._builder.capTable = builderPair.sourceInfo._builder.capTable;
  (this->sourceInfo)._builder.data = builderPair.sourceInfo._builder.data;
  (this->sourceInfo)._builder.pointers = builderPair.sourceInfo._builder.pointers;
  (this->sourceInfo)._builder.dataSize = builderPair.sourceInfo._builder.dataSize;
  (this->sourceInfo)._builder.pointerCount = builderPair.sourceInfo._builder.pointerCount;
  *(undefined2 *)&(this->sourceInfo)._builder.field_0x26 = builderPair.sourceInfo._builder._38_2_;
  (this->field_21).fieldScope = (StructOrGroup *)0x0;
  if (0x1f < (decl->_reader).dataSize) {
    local_50.left = *(Which *)((long)(decl->_reader).data + 2);
  }
  local_50.right = FIELD;
  local_50.op.content.ptr = " != ";
  local_50.op.content.size_ = 5;
  local_50.result = local_50.left != FIELD;
  if (local_50.result) {
    bVar10 = Declaration::Reader::hasDocComment(decl);
    if (bVar10) {
      AVar13 = (ArrayPtr<const_char>)Declaration::Reader::getDocComment(decl);
      if ((this->docComment).ptr.isSet == true) {
        (this->docComment).ptr.isSet = false;
      }
      (this->docComment).ptr.field_1.value.super_StringPtr.content = AVar13;
      (this->docComment).ptr.isSet = true;
    }
    return;
  }
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::compiler::Declaration::Which,capnp::compiler::Declaration::Which>&>
            (&local_58,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/node-translator.c++"
             ,0x452,FAILED,"decl.which() != Declaration::FIELD","_kjCondition,",&local_50);
  kj::_::Debug::Fault::fatal(&local_58);
}

Assistant:

inline MemberInfo(MemberInfo& parent, uint codeOrder,
                      const Declaration::Reader& decl,
                      NodeSourceInfoBuilderPair builderPair,
                      bool isInUnion)
        : parent(&parent), codeOrder(codeOrder), isInUnion(isInUnion),
          name(decl.getName().getValue()), declId(decl.getId()), declKind(decl.which()),
          declAnnotations(decl.getAnnotations()),
          startByte(decl.getStartByte()), endByte(decl.getEndByte()),
          node(builderPair.node), sourceInfo(builderPair.sourceInfo), unionScope(nullptr) {
      KJ_REQUIRE(decl.which() != Declaration::FIELD);
      if (decl.hasDocComment()) {
        docComment = decl.getDocComment();
      }
    }